

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_input(ptls_t *tls,ptls_buffer_t *sendbuf,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  int iVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  uint8_t *local_78;
  uint8_t *local_70;
  ptls_iovec_t message;
  undefined1 local_58 [4];
  int ret;
  st_ptls_record_t rec;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *decryptbuf_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  
  rec.fragment = (uint8_t *)properties;
  message.len._4_4_ = parse_record(tls,(st_ptls_record_t *)local_58,(uint8_t *)input,inlen);
  if (message.len._4_4_ != 0) {
    return message.len._4_4_;
  }
  if (rec.length == 0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x88e,
                  "int handle_input(ptls_t *, ptls_buffer_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
    if (local_58[0] != '\x17') {
      return 0x28;
    }
    message.len._4_4_ = ptls_buffer_reserve(decryptbuf,rec._0_8_ + 5);
    if (message.len._4_4_ != 0) {
      return message.len._4_4_;
    }
    iVar1 = ptls_aead_transform((tls->traffic_protection).dec.aead,
                                decryptbuf->base + decryptbuf->off,(size_t *)&rec,(void *)rec.length
                                ,rec._0_8_,'\0');
    if (iVar1 != 0) {
      if (-1 < (char)(*(char *)&(tls->field_7).server << 6)) {
        return iVar1;
      }
      message.len._4_4_ = 0x202;
      goto LAB_001148bd;
    }
    *(byte *)&(tls->field_7).server = *(byte *)&(tls->field_7).server & 0xfd;
    rec.length = (size_t)(decryptbuf->base + decryptbuf->off);
    for (; (rec._0_8_ != 0 && (*(uint8_t *)(rec.length + rec._0_8_ + -1) == '\0'));
        rec._0_8_ = rec._0_8_ + -1) {
    }
    if (rec._0_8_ == 0) {
      return 10;
    }
    local_58[0] = *(uint8_t *)(rec.length + rec._0_8_ + -1);
    rec._0_8_ = rec._0_8_ + -1;
  }
  message.len._4_4_ = 0;
  if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (local_58[0] != '\x16')) {
    if (local_58[0] == '\x15') {
      message.len._4_4_ = handle_alert(tls,(uint8_t *)rec.length,rec._0_8_);
    }
    else if (local_58[0] == '\x17') {
      if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
        if (tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) {
          if ((tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0) {
            decryptbuf->off = rec._0_8_ + decryptbuf->off;
          }
          message.len._4_4_ = 0;
        }
        else {
          message.len._4_4_ = 10;
        }
      }
      else {
        decryptbuf->off = rec._0_8_ + decryptbuf->off;
        message.len._4_4_ = 0;
      }
    }
    else {
      message.len._4_4_ = 10;
    }
  }
  else {
    memset(&local_70,0,0x10);
    if (local_58[0] != '\x16') {
      return 0x32;
    }
    if (((tls->recvbuf).mess.base == (uint8_t *)0x0) &&
       (iVar1 = test_handshake_message((uint8_t *)rec.length,rec._0_8_), iVar1 == 0)) {
      pVar2 = ptls_iovec_init((void *)rec.length,rec._0_8_);
      local_80 = pVar2.base;
      local_70 = local_80;
      local_78 = (uint8_t *)pVar2.len;
      message.base = local_78;
    }
    else {
      message.len._4_4_ = ptls_buffer_reserve(&(tls->recvbuf).mess,rec._0_8_);
      if (message.len._4_4_ != 0) {
        return message.len._4_4_;
      }
      memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,(void *)rec.length,rec._0_8_);
      (tls->recvbuf).mess.off = rec._0_8_ + (tls->recvbuf).mess.off;
      message.len._4_4_ = test_handshake_message((tls->recvbuf).mess.base,(tls->recvbuf).mess.off);
      if (message.len._4_4_ == 0) {
        pVar2 = ptls_iovec_init((tls->recvbuf).mess.base,(tls->recvbuf).mess.off);
        local_90 = pVar2.base;
        local_70 = local_90;
        local_88 = (uint8_t *)pVar2.len;
        message.base = local_88;
      }
    }
    if (local_70 != (uint8_t *)0x0) {
      pVar2.len = (size_t)message.base;
      pVar2.base = local_70;
      message.len._4_4_ =
           handle_handshake_message(tls,sendbuf,pVar2,(ptls_handshake_properties_t *)rec.fragment);
      ptls_buffer_dispose(&(tls->recvbuf).mess);
    }
  }
LAB_001148bd:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  return message.len._4_4_;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (tls->traffic_protection.dec.aead != NULL) {
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = ptls_aead_transform(tls->traffic_protection.dec.aead, decryptbuf->base + decryptbuf->off, &rec.length,
                                       rec.fragment, rec.length, 0)) != 0) {
            if (tls->server.skip_early_data) {
                ret = PTLS_ERROR_HANDSHAKE_IN_PROGRESS;
                goto NextRecord;
            }
            return ret;
        }
        tls->server.skip_early_data = 0;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {

        /* handshake */
        ptls_iovec_t message = {NULL};
        if (rec.type != PTLS_CONTENT_TYPE_HANDSHAKE)
            return PTLS_ALERT_DECODE_ERROR;

        /* handle the record directly, or buffer the message split into multiple records */
        if (tls->recvbuf.mess.base == NULL && test_handshake_message(rec.fragment, rec.length) == 0) {
            message = ptls_iovec_init(rec.fragment, rec.length);
        } else {
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec.length)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec.fragment, rec.length);
            tls->recvbuf.mess.off += rec.length;
            if ((ret = test_handshake_message(tls->recvbuf.mess.base, tls->recvbuf.mess.off)) == 0)
                message = ptls_iovec_init(tls->recvbuf.mess.base, tls->recvbuf.mess.off);
        }

        /* handle the complete message, if available */
        if (message.base != NULL) {
            ret = handle_handshake_message(tls, sendbuf, message, properties);
            ptls_buffer_dispose(&tls->recvbuf.mess);
        }

    } else {

        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_FINISHED) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;
}